

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O1

void __thiscall minihttp::HttpSocket::_ParseHeader(HttpSocket *this)

{
  uint *puVar1;
  int *__haystack;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  
  std::__cxx11::string::append((char *)&this->_tmpHdr);
  __haystack = (int *)(this->_tmpHdr)._M_dataplus._M_p;
  if ((((this->super_TcpSocket)._recvSize < 5) && ((this->_tmpHdr)._M_string_length < 5)) ||
     ((char)__haystack[1] == '/' && *__haystack == 0x50545448)) {
    pcVar3 = strstr((char *)__haystack,"\r\n\r\n");
    if (pcVar3 != (char *)0x0) {
      pcVar4 = strchr((char *)((long)__haystack + 5),0x20);
      if (pcVar4 != (char *)0x0) {
        uVar2 = atoi(pcVar4 + 1);
        this->_status = uVar2;
        this->_chunkedTransfer = false;
        this->_contentLen = 0;
        pcVar4 = strstr(pcVar4 + 1,"\r\n");
        _ParseHeaderFields(this,pcVar4 + 2,(long)pcVar3 - (long)pcVar4);
        _HandleStatus(this);
        pcVar3 = (this->super_TcpSocket)._inbuf;
        pcVar4 = strstr(pcVar3,"\r\n\r\n");
        (this->super_TcpSocket)._readptr = pcVar4 + 4;
        puVar1 = &(this->super_TcpSocket)._recvSize;
        *puVar1 = *puVar1 + ((int)pcVar3 - (int)(pcVar4 + 4));
        (this->_tmpHdr)._M_string_length = 0;
        *(this->_tmpHdr)._M_dataplus._M_p = '\0';
      }
    }
  }
  return;
}

Assistant:

void HttpSocket::_ParseHeader(void)
{
    _tmpHdr += _inbuf;
    const char *hptr = _tmpHdr.c_str();

    if((_recvSize >= 5 || _tmpHdr.size() >= 5) && memcmp("HTTP/", hptr, 5))
    {
        traceprint("_ParseHeader: not HTTP stream\n");
        return;
    }

    const char *hdrend = strstr(hptr, "\r\n\r\n");
    if(!hdrend)
    {
        traceprint("_ParseHeader: could not find end-of-header marker, or incomplete buf; delaying.\n");
        return;
    }

    //traceprint(hptr);

    hptr = strchr(hptr + 5, ' '); // skip "HTTP/", already known
    if(!hptr)
        return; // WTF?
    ++hptr; // number behind first space is the status code
    _status = atoi(hptr);

    // Default values
    _chunkedTransfer = false;
    _contentLen = 0; // yet unknown

    hptr = strstr(hptr, "\r\n");
    _ParseHeaderFields(hptr + 2, hdrend - hptr);

    // FIXME: return value indicates success.
    // Bail out on non-success, or at least make it so that _OnRecv() is not called.
    // (Unless an override bool is given that even non-successful answers get their data delivered!)
    _HandleStatus();

    // get ready
    _readptr = strstr(_inbuf, "\r\n\r\n") + 4; // skip double newline. must have been found in hptr earlier.
    _recvSize -= (_readptr - _inbuf); // skip the header part
    _tmpHdr.clear();
}